

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ImFontAtlas(ImFontAtlas *this)

{
  undefined1 *in_RDI;
  int n;
  int local_28;
  ImVec2 local_24;
  ImVec2 local_1c [3];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x30));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x38));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x40));
  ImVector<ImFontAtlas::CustomRect>::ImVector((ImVector<ImFontAtlas::CustomRect> *)(in_RDI + 0x50));
  ImVector<ImFontConfig>::ImVector((ImVector<ImFontConfig> *)(in_RDI + 0x60));
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 1;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  ImVec2::ImVec2(local_1c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x30) = local_1c[0];
  ImVec2::ImVec2(&local_24,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x38) = local_24;
  for (local_28 = 0; local_28 < 1; local_28 = local_28 + 1) {
    *(undefined4 *)(in_RDI + (long)local_28 * 4 + 0x70) = 0xffffffff;
  }
  return;
}

Assistant:

ImFontAtlas::ImFontAtlas()
{
    Locked = false;
    Flags = ImFontAtlasFlags_None;
    TexID = (ImTextureID)NULL;
    TexDesiredWidth = 0;
    TexGlyphPadding = 1;

    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
    TexWidth = TexHeight = 0;
    TexUvScale = ImVec2(0.0f, 0.0f);
    TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}